

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O1

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem *items,int count,float width_excess)

{
  ulong uVar1;
  uint uVar2;
  long lVar3;
  int n;
  ulong uVar4;
  float fVar5;
  float fVar6;
  
  if (count == 1) {
    fVar5 = items->Width - width_excess;
    if (fVar5 <= 1.0) {
      fVar5 = 1.0;
    }
    items->Width = fVar5;
  }
  else {
    qsort(items,(long)count,8,ShrinkWidthItemComparer);
    uVar1 = (ulong)(uint)count;
    if ((1 < count) && (0.0 < width_excess)) {
      lVar3 = 1;
      do {
        lVar3 = (long)(int)lVar3;
        do {
          if (items[lVar3].Width < items->Width) {
            fVar5 = items->Width - items[lVar3].Width;
            goto LAB_0018162a;
          }
          lVar3 = lVar3 + 1;
        } while (lVar3 < (long)uVar1);
        fVar5 = items->Width + -1.0;
LAB_0018162a:
        uVar2 = (uint)lVar3;
        fVar6 = width_excess / (float)(int)uVar2;
        if (fVar5 <= fVar6) {
          fVar6 = fVar5;
        }
        if (0 < (int)uVar2) {
          uVar4 = 0;
          do {
            items[uVar4].Width = items[uVar4].Width - fVar6;
            uVar4 = uVar4 + 1;
          } while ((uVar2 & 0x7fffffff) != uVar4);
        }
      } while (((int)uVar2 < count) &&
              (width_excess = width_excess - fVar6 * (float)(int)uVar2, 0.0 < width_excess));
    }
    fVar5 = 0.0;
    if (0 < count) {
      uVar4 = 0;
      do {
        fVar6 = (float)(int)items[uVar4].Width;
        fVar5 = fVar5 + (items[uVar4].Width - fVar6);
        items[uVar4].Width = fVar6;
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
    if (0 < count && 0.0 < fVar5) {
      uVar4 = 0;
      do {
        if (items[uVar4].Index < (int)(fVar5 + 0.01)) {
          items[uVar4].Width = items[uVar4].Width + 1.0;
        }
        uVar4 = uVar4 + 1;
      } while (uVar1 != uVar4);
    }
  }
  return;
}

Assistant:

void ImGui::ShrinkWidths(ImGuiShrinkWidthItem* items, int count, float width_excess)
{
    if (count == 1)
    {
        items[0].Width = ImMax(items[0].Width - width_excess, 1.0f);
        return;
    }
    ImQsort(items, (size_t)count, sizeof(ImGuiShrinkWidthItem), ShrinkWidthItemComparer);
    int count_same_width = 1;
    while (width_excess > 0.0f && count_same_width < count)
    {
        while (count_same_width < count && items[0].Width <= items[count_same_width].Width)
            count_same_width++;
        float max_width_to_remove_per_item = (count_same_width < count) ? (items[0].Width - items[count_same_width].Width) : (items[0].Width - 1.0f);
        float width_to_remove_per_item = ImMin(width_excess / count_same_width, max_width_to_remove_per_item);
        for (int item_n = 0; item_n < count_same_width; item_n++)
            items[item_n].Width -= width_to_remove_per_item;
        width_excess -= width_to_remove_per_item * count_same_width;
    }

    // Round width and redistribute remainder left-to-right (could make it an option of the function?)
    // Ensure that e.g. the right-most tab of a shrunk tab-bar always reaches exactly at the same distance from the right-most edge of the tab bar separator.
    width_excess = 0.0f;
    for (int n = 0; n < count; n++)
    {
        float width_rounded = ImFloor(items[n].Width);
        width_excess += items[n].Width - width_rounded;
        items[n].Width = width_rounded;
    }
    if (width_excess > 0.0f)
        for (int n = 0; n < count; n++)
            if (items[n].Index < (int)(width_excess + 0.01f))
                items[n].Width += 1.0f;
}